

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.h
# Opt level: O2

void __thiscall miniros::network::NetAddress::NetAddress(NetAddress *this)

{
  this->type = AddressInvalid;
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  this->port = 0;
  this->rawAddress = (void *)0x0;
  return;
}

Assistant:

struct MINIROS_DECL NetAddress {
  enum Type {
    AddressInvalid,
    AddressIPv4,
    AddressIPv6,
  };

  Type type = AddressInvalid;

  /// String representation of network address.
  /// It does not contain port. It can contain some DNS name.
  std::string address;

  /// Network port.
  int port = 0;

  /// Pointer to actual address implementation.
  /// It points to sockaddr_t or one of its variants.
  void* rawAddress = nullptr;

  NetAddress();
  NetAddress(const NetAddress& other);
  NetAddress(NetAddress&& other) noexcept;
  ~NetAddress();

  NetAddress& operator=(const NetAddress& other);

  /// Reset internal address.
  void reset();

  /// Check if an address is local one.
  bool isLocal() const;

  /// Check if address is valid.
  bool valid() const { return type != AddressInvalid; }

  /// Generate string representation of an address.
  std::string str() const;

  /// Check type of provided address in a string form.
  static Type checkAddressType(const std::string& address);

  friend bool operator < (const NetAddress& a, const NetAddress& b);
  friend bool operator == (const NetAddress& a, const NetAddress& b);
  friend bool operator != (const NetAddress& a, const NetAddress& b);
}